

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summaryindex.cpp
# Opt level: O0

void summaryindex::indexevents
               (string *binfilename,string *idxfilename,
               map<summary_period,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_period>,_std::allocator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
               *summaryfileperiod_to_offset,int file_id,
               map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
               *eventtoperiods)

{
  FILE *pFVar1;
  bool bVar2;
  char *pcVar3;
  FILE *__stream;
  undefined8 uVar4;
  FILE *__stream_00;
  pointer ppVar5;
  reference piVar6;
  mapped_type *this;
  const_iterator cStack_1098;
  int period;
  const_iterator __end2;
  const_iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  _Self local_1078;
  const_iterator iter;
  summarySampleslevelHeader sh;
  int ret;
  longlong offset;
  int local_1050;
  summary_period k;
  char line [4096];
  FILE *fbin;
  FILE *fidx;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  *eventtoperiods_local;
  int file_id_local;
  map<summary_period,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_period>,_std::allocator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
  *summaryfileperiod_to_offset_local;
  string *idxfilename_local;
  string *binfilename_local;
  
  pcVar3 = (char *)std::__cxx11::string::c_str();
  __stream = fopen(pcVar3,"r");
  pFVar1 = _stderr;
  if (__stream == (FILE *)0x0) {
    uVar4 = std::__cxx11::string::c_str();
    fprintf(pFVar1,"FATAL: Cannot open %s\n",uVar4);
    exit(1);
  }
  pcVar3 = (char *)std::__cxx11::string::c_str();
  __stream_00 = fopen(pcVar3,"r");
  pFVar1 = _stderr;
  local_1050 = file_id;
  if (__stream_00 != (FILE *)0x0) {
    while( true ) {
      pcVar3 = fgets((char *)&k.fileindex,0x1000,__stream);
      if (pcVar3 == (char *)0x0) {
        fclose(__stream);
        fclose(__stream_00);
        return;
      }
      sh.summary_id = __isoc99_sscanf(&k.fileindex,"%d,%lld",(long)&offset + 4,&sh.expval);
      pFVar1 = _stderr;
      if (sh.summary_id != 2) break;
      fseek(__stream_00,stack0xffffffffffffefa0,0);
      fread(&iter,0xc,1,__stream_00);
      local_1078._M_node =
           (_Base_ptr)
           std::
           map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
           ::find(eventtoperiods,(key_type *)&iter);
      __range2 = (vector<int,_std::allocator<int>_> *)
                 std::
                 map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                 ::end(eventtoperiods);
      bVar2 = std::operator==(&local_1078,(_Self *)&__range2);
      if (!bVar2) {
        ppVar5 = std::
                 _Rb_tree_const_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                 ::operator->(&local_1078);
        __end2 = std::vector<int,_std::allocator<int>_>::begin(&ppVar5->second);
        cStack_1098 = std::vector<int,_std::allocator<int>_>::end(&ppVar5->second);
        while (bVar2 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffef68), bVar2) {
          piVar6 = __gnu_cxx::
                   __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&__end2);
          k.summary_id = *piVar6;
          this = std::
                 map<summary_period,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_period>,_std::allocator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                 ::operator[](summaryfileperiod_to_offset,(key_type *)((long)&offset + 4));
          std::vector<long_long,_std::allocator<long_long>_>::push_back
                    (this,(value_type_conflict2 *)&sh.expval);
          __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
          operator++(&__end2);
        }
      }
    }
    uVar4 = std::__cxx11::string::c_str();
    fprintf(pFVar1,"FATAL: Invalid data in file %s:\n%s",uVar4,&k.fileindex);
    exit(1);
  }
  uVar4 = std::__cxx11::string::c_str();
  fprintf(pFVar1,"FATAL: Cannot open %s\n",uVar4);
  exit(1);
}

Assistant:

void indexevents(const std::string &binfilename, std::string &idxfilename, std::map<summary_period, std::vector<long long>> &summaryfileperiod_to_offset, int file_id, const std::map<int, std::vector<int>> &eventtoperiods) {

		FILE * fidx = fopen(idxfilename.c_str(), "r");
		if (fidx == nullptr) {
			fprintf(stderr, "FATAL: Cannot open %s\n", idxfilename.c_str());
			exit(EXIT_FAILURE);
		}
		FILE * fbin = fopen(binfilename.c_str(), "r");
		if (fbin == nullptr) {
			fprintf(stderr, "FATAL: Cannot open %s\n", binfilename.c_str());
			exit(EXIT_FAILURE);
		}

		char line[4096];
		summary_period k;
		k.fileindex = file_id;
		while (fgets(line, sizeof(line), fidx) != 0) {
			long long offset;
			int ret = sscanf(line, "%d,%lld", &k.summary_id, &offset);
			if (ret != 2) {
				fprintf(stderr, "FATAL: Invalid data in file %s:\n%s", idxfilename.c_str(), line);
				exit(EXIT_FAILURE);
			}
			// Get period numbers from event IDs
			flseek(fbin, offset, SEEK_SET);
			summarySampleslevelHeader sh;
			fread(&sh, sizeof(sh), 1, fbin);
			std::map<int, std::vector<int>>::const_iterator iter = eventtoperiods.find(sh.event_id);
			if (iter == eventtoperiods.end()) continue;   // Event not found so don't process it
			for (auto period : iter->second) {
				k.period_no = period;
				summaryfileperiod_to_offset[k].push_back(offset);
			}
		}

		fclose(fidx);
		fclose(fbin);

	}